

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
read_name(optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
         string_view buf)

{
  const_iterator pvVar1;
  const_iterator __last;
  char *pcVar2;
  undefined1 local_18 [8];
  string_view buf_local;
  
  buf_local._M_len = (size_t)buf._M_str;
  local_18 = (undefined1  [8])buf._M_len;
  pvVar1 = std::begin<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  __last = std::end<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  pcVar2 = std::find_if_not<char_const*,bool(*)(int)noexcept>(pvVar1,__last,is_char_name);
  pvVar1 = std::end<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  if (pcVar2 == pvVar1) {
    std::make_optional<std::basic_string_view<char,std::char_traits<char>>const&>
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)local_18);
  }
  else {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view>
read_name(const std::string_view buf) noexcept
{
    return std::find_if_not(std::begin(buf), std::end(buf), is_char_name) ==
               std::end(buf)
             ? std::make_optional(buf)
             : std::nullopt;
}